

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_genn.cc
# Opt level: O0

int othername_cmp(OTHERNAME *a,OTHERNAME *b)

{
  int result;
  OTHERNAME *b_local;
  OTHERNAME *a_local;
  
  if ((a == (OTHERNAME *)0x0) || (b == (OTHERNAME *)0x0)) {
    a_local._4_4_ = -1;
  }
  else {
    a_local._4_4_ = OBJ_cmp((ASN1_OBJECT *)a->type_id,(ASN1_OBJECT *)b->type_id);
    if (a_local._4_4_ == 0) {
      a_local._4_4_ = ASN1_TYPE_cmp((ASN1_TYPE *)a->value,(ASN1_TYPE *)b->value);
    }
  }
  return a_local._4_4_;
}

Assistant:

static int othername_cmp(const OTHERNAME *a, const OTHERNAME *b) {
  int result = -1;

  if (!a || !b) {
    return -1;
  }
  // Check their type first.
  if ((result = OBJ_cmp(a->type_id, b->type_id)) != 0) {
    return result;
  }
  // Check the value.
  result = ASN1_TYPE_cmp(a->value, b->value);
  return result;
}